

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignVarCommand.cpp
# Opt level: O0

double __thiscall AssignVarCommand::execute(AssignVarCommand *this)

{
  MathInterpreter *this_00;
  DataBase *this_01;
  bool bVar1;
  reference pvVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar3;
  mapped_type *ppVVar4;
  double __val;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  Variable *local_a0;
  Variable *temp;
  _Self local_90;
  string local_88 [48];
  string local_58;
  undefined4 local_34;
  undefined1 local_30 [4];
  int p;
  string var_name;
  AssignVarCommand *this_local;
  
  var_name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  this_00 = this->i;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->param_v,0);
  std::__cxx11::string::string((string *)&local_58,(string *)pvVar2);
  MathInterpreter::insertVariables(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->param_v,0);
  local_34 = std::__cxx11::string::find((char *)pvVar2,0x120aa4);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->param_v,0);
  std::__cxx11::string::substr((ulong)local_88,(ulong)pvVar2);
  std::__cxx11::string::operator=((string *)local_30,local_88);
  std::__cxx11::string::~string(local_88);
  pmVar3 = DataBase::getInVarMap_abi_cxx11_(d);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       ::find(pmVar3,(key_type *)local_30);
  pmVar3 = DataBase::getInVarMap_abi_cxx11_(d);
  temp = (Variable *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
         ::end(pmVar3);
  bVar1 = std::operator==(&local_90,(_Self *)&temp);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pmVar3 = DataBase::getInVarMap_abi_cxx11_(d);
    ppVVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::at(pmVar3,(key_type *)local_30);
    local_a0 = *ppVVar4;
    Variable::getBindSimbol_abi_cxx11_(&local_c0,local_a0);
    bVar1 = std::operator==(&local_c0,"->");
    std::__cxx11::string::~string((string *)&local_c0);
    this_01 = d;
    if (bVar1) {
      Variable::getSim_abi_cxx11_(&local_160,local_a0);
      std::operator+(&local_140,"set ",&local_160);
      std::operator+(&local_120,&local_140," ");
      (**(local_a0->super_Expression)._vptr_Expression)();
      std::__cxx11::to_string(&local_180,__val);
      std::operator+(&local_100,&local_120,&local_180);
      std::operator+(&local_e0,&local_100,"\r\n");
      DataBase::addToUpdateSimQueue(this_01,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return 0.0;
}

Assistant:

double AssignVarCommand::execute() {
  string var_name;
  int p;
  //assing in data
  this->i->insertVariables((this->param_v)[0]);
  //assign in simulator
  p = this->param_v[0].find("=");
  var_name = param_v[0].substr(0, p);
  if (!(d->getInVarMap()->find(var_name) == d->getInVarMap()->end())) {
    Variable *temp = d->getInVarMap()->at(var_name);
    // send instruction to simulator
    if (temp->getBindSimbol() == "->") {
      d->addToUpdateSimQueue(
          "set " + temp->getSim() + " " + to_string(temp->calculate())
              + "\r\n");
    }
  }
  return 0;
}